

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jasper.c
# Opt level: O1

cmdopts_t * cmdopts_parse(int argc,char **argv)

{
  char *pcVar1;
  undefined4 uVar2;
  int iVar3;
  cmdopts_t *extraout_RAX;
  cmdopts_t *pcVar4;
  ulonglong uVar5;
  char *__ptr;
  
  __ptr = (char *)0x2060;
  pcVar4 = (cmdopts_t *)malloc(0x2060);
  if (pcVar4 == (cmdopts_t *)0x0) {
LAB_00102bab:
    cmdopts_parse_cold_5();
<EXTERNAL>_free:
    cmdopts_parse_cold_4();
    free(__ptr);
    return extraout_RAX;
  }
  pcVar4->infile = (char *)0x0;
  pcVar4->infmt = -1;
  pcVar4->inopts = (char *)0x0;
  pcVar4->inoptsbuf[0] = '\0';
  pcVar4->outfile = (char *)0x0;
  pcVar4->outfmt = -1;
  pcVar4->outopts = (char *)0x0;
  pcVar4->outoptsbuf[0] = '\0';
  pcVar4->verbose = 0;
  pcVar4->debug = 0;
  pcVar4->version = 0;
  pcVar4->cmptno = -1;
  pcVar4->srgb = 0;
  do {
    __ptr = (char *)(ulong)(uint)argc;
    uVar2 = jas_getopt((char *)(ulong)(uint)argc,argv,cmdopts_parse::cmdoptions);
    pcVar1 = _jas_optarg;
    switch(uVar2) {
    case 0:
      cmdusage();
      goto LAB_00102bab;
    case 1:
      pcVar4->verbose = 1;
      break;
    case 2:
      pcVar4->infile = _jas_optarg;
      break;
    case 3:
      iVar3 = jas_image_strtofmt(_jas_optarg);
      pcVar4->infmt = iVar3;
      if (iVar3 < 0) {
        fprintf(_stderr,"warning: ignoring invalid input format %s\n",pcVar1);
        pcVar4->infmt = -1;
      }
      break;
    case 4:
      addopt(pcVar4->inoptsbuf,0x1000,_jas_optarg);
      pcVar4->inopts = pcVar4->inoptsbuf;
      break;
    case 5:
      pcVar4->outfile = _jas_optarg;
      break;
    case 6:
      iVar3 = jas_image_strtofmt(_jas_optarg);
      pcVar4->outfmt = iVar3;
      if (iVar3 < 0) {
        cmdopts_parse_cold_1();
switchD_001029da_default:
        badusage();
      }
      break;
    case 7:
      addopt(pcVar4->outoptsbuf,0x1000,_jas_optarg);
      pcVar4->outopts = pcVar4->outoptsbuf;
      break;
    case 8:
      pcVar4->version = 1;
      break;
    case 9:
      iVar3 = atoi(_jas_optarg);
      pcVar4->debug = iVar3;
      break;
    case 10:
      iVar3 = atoi(_jas_optarg);
      pcVar4->cmptno = (long)iVar3;
      break;
    case 0xb:
      pcVar4->srgb = 1;
      break;
    case 0xc:
      uVar5 = strtoull(_jas_optarg,(char **)0x0,10);
      pcVar4->max_mem = uVar5;
      break;
    case 0xffffffff:
      __ptr = (char *)(ulong)_jas_optind;
      if ((int)_jas_optind < argc) {
        cmdopts_parse_cold_2();
      }
      if (pcVar4->version == 0) {
        if ((pcVar4->outfmt < 0) && (__ptr = pcVar4->outfile, __ptr != (char *)0x0)) {
          iVar3 = jas_image_fmtfromname();
          pcVar4->outfmt = iVar3;
          if (iVar3 < 0) {
            cmdopts_parse_cold_3();
          }
        }
        if (pcVar4->outfmt < 0) goto <EXTERNAL>_free;
      }
      return pcVar4;
    default:
      goto switchD_001029da_default;
    }
  } while( true );
}

Assistant:

cmdopts_t *cmdopts_parse(int argc, char **argv)
{
	enum {
		CMDOPT_HELP = 0,
		CMDOPT_VERBOSE,
		CMDOPT_INFILE,
		CMDOPT_INFMT,
		CMDOPT_INOPT,
		CMDOPT_OUTFILE,
		CMDOPT_OUTFMT,
		CMDOPT_OUTOPT,
		CMDOPT_VERSION,
		CMDOPT_DEBUG,
		CMDOPT_CMPTNO,
		CMDOPT_SRGB,
		CMDOPT_MAXMEM
	};

	static const jas_opt_t cmdoptions[] = {
		{CMDOPT_HELP, "help", 0},
		{CMDOPT_VERBOSE, "verbose", 0},
		{CMDOPT_INFILE, "input", JAS_OPT_HASARG},
		{CMDOPT_INFILE, "f", JAS_OPT_HASARG},
		{CMDOPT_INFMT, "input-format", JAS_OPT_HASARG},
		{CMDOPT_INFMT, "t", JAS_OPT_HASARG},
		{CMDOPT_INOPT, "input-option", JAS_OPT_HASARG},
		{CMDOPT_INOPT, "o", JAS_OPT_HASARG},
		{CMDOPT_OUTFILE, "output", JAS_OPT_HASARG},
		{CMDOPT_OUTFILE, "F", JAS_OPT_HASARG},
		{CMDOPT_OUTFMT, "output-format", JAS_OPT_HASARG},
		{CMDOPT_OUTFMT, "T", JAS_OPT_HASARG},
		{CMDOPT_OUTOPT, "output-option", JAS_OPT_HASARG},
		{CMDOPT_OUTOPT, "O", JAS_OPT_HASARG},
		{CMDOPT_VERSION, "version", 0},
		{CMDOPT_DEBUG, "debug-level", JAS_OPT_HASARG},
		{CMDOPT_CMPTNO, "cmptno", JAS_OPT_HASARG},
		{CMDOPT_SRGB, "force-srgb", 0},
		{CMDOPT_SRGB, "S", 0},
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
		{CMDOPT_MAXMEM, "memory-limit", JAS_OPT_HASARG},
#endif
		{-1, 0, 0}
	};

	cmdopts_t *cmdopts;
	int c;

	if (!(cmdopts = malloc(sizeof(cmdopts_t)))) {
		fprintf(stderr, "error: insufficient memory\n");
		exit(EXIT_FAILURE);
	}

	cmdopts->infile = 0;
	cmdopts->infmt = -1;
	cmdopts->inopts = 0;
	cmdopts->inoptsbuf[0] = '\0';
	cmdopts->outfile = 0;
	cmdopts->outfmt = -1;
	cmdopts->outopts = 0;
	cmdopts->outoptsbuf[0] = '\0';
	cmdopts->verbose = 0;
	cmdopts->version = 0;
	cmdopts->cmptno = -1;
	cmdopts->debug = 0;
	cmdopts->srgb = 0;
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
	cmdopts->max_mem = JAS_DEFAULT_MAX_MEM_USAGE;
#endif

	while ((c = jas_getopt(argc, argv, cmdoptions)) != EOF) {
		switch (c) {
		case CMDOPT_HELP:
			cmdusage();
			break;
		case CMDOPT_VERBOSE:
			cmdopts->verbose = 1;
			break;
		case CMDOPT_VERSION:
			cmdopts->version = 1;
			break;
		case CMDOPT_DEBUG:
			cmdopts->debug = atoi(jas_optarg);
			break;
		case CMDOPT_INFILE:
			cmdopts->infile = jas_optarg;
			break;
		case CMDOPT_INFMT:
			if ((cmdopts->infmt = jas_image_strtofmt(jas_optarg)) < 0) {
				fprintf(stderr, "warning: ignoring invalid input format %s\n",
				  jas_optarg);
				cmdopts->infmt = -1;
			}
			break;
		case CMDOPT_INOPT:
			addopt(cmdopts->inoptsbuf, OPTSMAX, jas_optarg);
			cmdopts->inopts = cmdopts->inoptsbuf;
			break;
		case CMDOPT_OUTFILE:
			cmdopts->outfile = jas_optarg;
			break;
		case CMDOPT_OUTFMT:
			if ((cmdopts->outfmt = jas_image_strtofmt(jas_optarg)) < 0) {
				fprintf(stderr, "error: invalid output format %s\n", jas_optarg);
				badusage();
			}
			break;
		case CMDOPT_OUTOPT:
			addopt(cmdopts->outoptsbuf, OPTSMAX, jas_optarg);
			cmdopts->outopts = cmdopts->outoptsbuf;
			break;
		case CMDOPT_CMPTNO:
			cmdopts->cmptno = atoi(jas_optarg);
			break;
		case CMDOPT_SRGB:
			cmdopts->srgb = 1;
			break;
		case CMDOPT_MAXMEM:
			cmdopts->max_mem = strtoull(jas_optarg, 0, 10);
			break;
		default:
			badusage();
			break;
		}
	}

	while (jas_optind < argc) {
		fprintf(stderr,
		  "warning: ignoring bogus command line argument %s\n",
		  argv[jas_optind]);
		++jas_optind;
	}

	if (cmdopts->version) {
		goto done;
	}

	if (cmdopts->outfmt < 0 && cmdopts->outfile) {
		if ((cmdopts->outfmt = jas_image_fmtfromname(cmdopts->outfile)) < 0) {
			fprintf(stderr,
			  "error: cannot guess image format from output file name\n");
		}
	}

	if (cmdopts->outfmt < 0) {
		fprintf(stderr, "error: no output format specified\n");
		badusage();
	}

done:
	return cmdopts;
}